

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DecryptionHelper.cpp
# Opt level: O0

bool HasCryptFilterDefinition(PDFParser *inParser,PDFStreamInput *inStream)

{
  bool bVar1;
  EPDFObjectType EVar2;
  PDFDictionary *pPVar3;
  PDFObject *pPVar4;
  PDFArray *this;
  PDFName *pPVar5;
  PDFName *pPVar6;
  string *psVar7;
  byte local_f9;
  undefined1 local_a0 [8];
  PDFObjectCastPtr<PDFName> filterObjectItem;
  unsigned_long i;
  bool foundCrypt;
  PDFArray *filterObjectArray;
  string local_70;
  undefined1 local_40 [8];
  RefCountPtr<PDFObject> filterObject;
  RefCountPtr<PDFDictionary> streamDictionary;
  PDFStreamInput *inStream_local;
  PDFParser *inParser_local;
  
  pPVar3 = PDFStreamInput::QueryStreamDictionary(inStream);
  RefCountPtr<PDFDictionary>::RefCountPtr((RefCountPtr<PDFDictionary> *)&filterObject.mValue,pPVar3)
  ;
  pPVar3 = RefCountPtr<PDFDictionary>::GetPtr((RefCountPtr<PDFDictionary> *)&filterObject.mValue);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_70,"Filter",(allocator<char> *)((long)&filterObjectArray + 7));
  pPVar4 = PDFParser::QueryDictionaryObject(inParser,pPVar3,&local_70);
  RefCountPtr<PDFObject>::RefCountPtr((RefCountPtr<PDFObject> *)local_40,pPVar4);
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator((allocator<char> *)((long)&filterObjectArray + 7));
  bVar1 = RefCountPtr<PDFObject>::operator!((RefCountPtr<PDFObject> *)local_40);
  if (bVar1) {
    inParser_local._7_1_ = false;
  }
  else {
    pPVar4 = RefCountPtr<PDFObject>::operator->((RefCountPtr<PDFObject> *)local_40);
    EVar2 = PDFObject::GetType(pPVar4);
    if (EVar2 == ePDFObjectArray) {
      this = (PDFArray *)RefCountPtr<PDFObject>::GetPtr((RefCountPtr<PDFObject> *)local_40);
      i._7_1_ = false;
      filterObjectItem.super_RefCountPtr<PDFName>.mValue = (PDFName *)0x0;
      while( true ) {
        pPVar6 = filterObjectItem.super_RefCountPtr<PDFName>.mValue;
        pPVar5 = (PDFName *)PDFArray::GetLength(this);
        local_f9 = 0;
        if (pPVar6 < pPVar5) {
          local_f9 = i._7_1_ ^ 0xff;
        }
        if ((local_f9 & 1) == 0) break;
        pPVar4 = PDFArray::QueryObject
                           (this,(unsigned_long)filterObjectItem.super_RefCountPtr<PDFName>.mValue);
        PDFObjectCastPtr<PDFName>::PDFObjectCastPtr((PDFObjectCastPtr<PDFName> *)local_a0,pPVar4);
        bVar1 = RefCountPtr<PDFName>::operator!((RefCountPtr<PDFName> *)local_a0);
        if (bVar1) {
          filterObjectArray._0_4_ = 2;
        }
        else {
          pPVar6 = RefCountPtr<PDFName>::operator->((RefCountPtr<PDFName> *)local_a0);
          psVar7 = PDFName::GetValue_abi_cxx11_(pPVar6);
          i._7_1_ = std::operator==(psVar7,"Crypt");
          filterObjectArray._0_4_ = 0;
        }
        PDFObjectCastPtr<PDFName>::~PDFObjectCastPtr((PDFObjectCastPtr<PDFName> *)local_a0);
        if ((int)filterObjectArray != 0) break;
        filterObjectItem.super_RefCountPtr<PDFName>.mValue =
             (PDFName *)
             ((long)&((filterObjectItem.super_RefCountPtr<PDFName>.mValue)->super_PDFObject).
                     super_RefCountObject._vptr_RefCountObject + 1);
      }
      inParser_local._7_1_ = i._7_1_;
    }
    else {
      pPVar4 = RefCountPtr<PDFObject>::operator->((RefCountPtr<PDFObject> *)local_40);
      EVar2 = PDFObject::GetType(pPVar4);
      if (EVar2 == ePDFObjectName) {
        pPVar6 = (PDFName *)RefCountPtr<PDFObject>::GetPtr((RefCountPtr<PDFObject> *)local_40);
        psVar7 = PDFName::GetValue_abi_cxx11_(pPVar6);
        inParser_local._7_1_ = std::operator==(psVar7,"Crypt");
      }
      else {
        inParser_local._7_1_ = false;
      }
    }
  }
  filterObjectArray._0_4_ = 1;
  RefCountPtr<PDFObject>::~RefCountPtr((RefCountPtr<PDFObject> *)local_40);
  RefCountPtr<PDFDictionary>::~RefCountPtr((RefCountPtr<PDFDictionary> *)&filterObject.mValue);
  return inParser_local._7_1_;
}

Assistant:

bool HasCryptFilterDefinition(PDFParser* inParser, PDFStreamInput* inStream) {
	RefCountPtr<PDFDictionary> streamDictionary(inStream->QueryStreamDictionary());

	// check if stream has a crypt filter
	RefCountPtr<PDFObject> filterObject(inParser->QueryDictionaryObject(streamDictionary.GetPtr(), "Filter"));
	if (!filterObject)
	{
		// no filter, so stop here
		return false;
	}

	if (filterObject->GetType() == PDFObject::ePDFObjectArray)
	{
		PDFArray* filterObjectArray = (PDFArray*)filterObject.GetPtr();
		bool foundCrypt = false;
		for (unsigned long i = 0; i < filterObjectArray->GetLength() && !foundCrypt; ++i)
		{
			PDFObjectCastPtr<PDFName> filterObjectItem(filterObjectArray->QueryObject(i));
			if (!filterObjectItem)
			{
				// error
				break;
			}
			foundCrypt = filterObjectItem->GetValue() == "Crypt";
		}
		return foundCrypt;
	}
	else if (filterObject->GetType() == PDFObject::ePDFObjectName)
	{
		return ((PDFName*)(filterObject.GetPtr()))->GetValue() == "Crypt";
	}
	else
		return false; //???
}